

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O1

void mserialize::detail::
     BuiltinDeserializer<std::tuple<int,std::vector<int,std::allocator<int>>,std::pair<short,short>,std::deque<char,std::allocator<char>>>,void>
     ::deserialize_elems<InputStream,0ul,1ul,2ul,3ul>
               (deque<char,_std::allocator<char>_> *t,InputStream *istream)

{
  std::istream::read((char *)istream->stream,
                     (long)&t[1].super__Deque_base<char,_std::allocator<char>_>._M_impl.
                            super__Deque_impl_data._M_start._M_last);
  BuiltinDeserializer<std::vector<int,_std::allocator<int>_>,_void>::deserialize<InputStream>
            ((vector<int,_std::allocator<int>_> *)
             &t[1].super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
              _M_map_size,istream);
  std::istream::read((char *)istream->stream,(long)(t + 1));
  std::istream::read((char *)istream->stream,
                     (long)((long)&t[1].super__Deque_base<char,_std::allocator<char>_>._M_impl.
                                   super__Deque_impl_data._M_map + 2));
  BuiltinDeserializer<std::deque<char,_std::allocator<char>_>,_void>::deserialize<InputStream>
            (t,istream);
  return;
}

Assistant:

static void deserialize_elems(Tuple<E...>& t, InputStream& istream, std::index_sequence<I...>)
  {
    using swallow = int[];
    using std::get;
    (void)swallow{1, (mserialize::deserialize(get<I>(t), istream), int{})...};
  }